

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynForEachIterator * ParseForEachIterator(ParseContext *ctx,bool isFirst)

{
  Lexeme *begin;
  bool bVar1;
  SynIdentifier *this;
  Lexeme *pLVar2;
  Lexeme *pLVar3;
  InplaceStr name_00;
  SynBase *local_60;
  SynBase *value;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  SynBase *type;
  Lexeme *start;
  bool isFirst_local;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  name.end = (char *)ParseType(ctx,(bool *)0x0,false);
  bVar1 = ParseContext::At(ctx,lex_string);
  if (!bVar1) {
    ctx->currentLexeme = begin;
    name.end = (char *)0x0;
  }
  bVar1 = ParseContext::At(ctx,lex_string);
  if (bVar1) {
    name_00 = ParseContext::Consume(ctx);
    this = ParseContext::get<SynIdentifier>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    pLVar3 = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier(this,pLVar2,pLVar3,name_00);
    if ((isFirst) && (bVar1 = ParseContext::At(ctx,lex_in), !bVar1)) {
      ctx->currentLexeme = begin;
      return (SynForEachIterator *)0x0;
    }
    anon_unknown.dwarf_fc7e::CheckConsume(ctx,lex_in,"ERROR: \'in\' expected after variable name");
    local_60 = ParseTernaryExpr(ctx);
    if (local_60 == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar2,"ERROR: expression expected after \'in\'");
      local_60 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      pLVar3 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_60,pLVar2,pLVar3);
    }
    ctx_local = (ParseContext *)ParseContext::get<SynForEachIterator>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynForEachIterator::SynForEachIterator
              ((SynForEachIterator *)ctx_local,begin,pLVar2,(SynBase *)name.end,this,local_60);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynForEachIterator *)ctx_local;
}

Assistant:

SynForEachIterator* ParseForEachIterator(ParseContext &ctx, bool isFirst)
{
	Lexeme *start = ctx.currentLexeme;

	// Optional type
	SynBase *type = ParseType(ctx);

	// Must be followed by a type
	if(!ctx.At(lex_string))
	{
		// Backtrack
		ctx.currentLexeme = start;

		type = NULL;
	}

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(isFirst && !ctx.At(lex_in))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_in, "ERROR: 'in' expected after variable name");

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'in'");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynForEachIterator>()) SynForEachIterator(start, ctx.Previous(), type, nameIdentifier, value);
	}

	return NULL;
}